

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O2

void Fra_AddClausesMux(Fra_Man_t *p,Aig_Obj_t *pNode)

{
  lit *end;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  char *__assertion;
  uint uVar9;
  uint uVar10;
  int pLits [4];
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  
  if (((ulong)pNode & 1) == 0) {
    iVar5 = Aig_ObjIsMuxType(pNode);
    if (iVar5 == 0) {
      __assertion = "Aig_ObjIsMuxType( pNode )";
      uVar4 = 0x34;
    }
    else {
      pAVar7 = Aig_ObjRecognizeMux(pNode,&pNodeT,&pNodeE);
      iVar1 = *(int *)(*(long *)((long)(pAVar7->field_5).pData + 0x98) + (long)pAVar7->Id * 4);
      iVar2 = *(int *)(*(long *)(*(long *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x28) + 0x98) +
                      (long)*(int *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x24) * 4);
      iVar3 = *(int *)(*(long *)(*(long *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x28) + 0x98) +
                      (long)*(int *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x24) * 4);
      iVar5 = iVar1 * 2 + 1;
      uVar9 = ((uint)pNodeT & 1) + iVar2 * 2;
      uVar4 = *(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) * 2;
      pLits[0] = iVar5;
      pLits[1] = uVar9 ^ 1;
      pLits[2] = uVar4;
      iVar6 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
      if (iVar6 == 0) {
        __assertion = "RetValue";
        uVar4 = 0x4c;
      }
      else {
        uVar8 = uVar4 | 1;
        end = pLits + 3;
        pLits[0] = iVar5;
        pLits[1] = uVar9;
        pLits[2] = uVar8;
        iVar5 = sat_solver_addclause(p->pSat,pLits,end);
        if (iVar5 == 0) {
          __assertion = "RetValue";
          uVar4 = 0x51;
        }
        else {
          iVar1 = iVar1 * 2;
          uVar10 = ((uint)pNodeE & 1) + iVar3 * 2;
          pLits[0] = iVar1;
          pLits[1] = uVar10 ^ 1;
          pLits[2] = uVar4;
          iVar5 = sat_solver_addclause(p->pSat,pLits,end);
          if (iVar5 == 0) {
            __assertion = "RetValue";
            uVar4 = 0x56;
          }
          else {
            pLits[0] = iVar1;
            pLits[1] = uVar10;
            pLits[2] = uVar8;
            iVar5 = sat_solver_addclause(p->pSat,pLits,end);
            if (iVar5 == 0) {
              __assertion = "RetValue";
              uVar4 = 0x5b;
            }
            else {
              if (iVar2 == iVar3) {
                return;
              }
              pLits[0] = uVar9;
              pLits[1] = uVar10;
              pLits[2] = uVar8;
              iVar5 = sat_solver_addclause(p->pSat,pLits,end);
              if (iVar5 == 0) {
                __assertion = "RetValue";
                uVar4 = 0x6e;
              }
              else {
                pLits[0] = uVar9 ^ 1;
                pLits[1] = uVar10 ^ 1;
                pLits[2] = uVar4;
                iVar5 = sat_solver_addclause(p->pSat,pLits,end);
                if (iVar5 != 0) {
                  return;
                }
                __assertion = "RetValue";
                uVar4 = 0x73;
              }
            }
          }
        }
      }
    }
  }
  else {
    __assertion = "!Aig_IsComplement( pNode )";
    uVar4 = 0x33;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                ,uVar4,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Addes clauses to the solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_AddClausesMux( Fra_Man_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Fra_ObjSatNum(pNode);
    VarI = Fra_ObjSatNum(pNodeI);
    VarT = Fra_ObjSatNum(Aig_Regular(pNodeT));
    VarE = Fra_ObjSatNum(Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}